

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupport_c_successWithOutputParameterOfType_TestShell::
~TEST_MockSupport_c_successWithOutputParameterOfType_TestShell
          (TEST_MockSupport_c_successWithOutputParameterOfType_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, successWithOutputParameterOfType)
{
    TestTestingFixture fixture;
    mock_c()->installCopier("intType", typeCopy);
    fixture.setTestFunction(callToMockCWithOutputParameterOfType_);
    fixture.runAllTests();
    LONGS_EQUAL(2, fixture.getCheckCount());
    LONGS_EQUAL(0, fixture.getFailureCount());
    mock_c()->removeAllComparatorsAndCopiers();
}